

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * getLinkInterfaceDependentProperty<char_const*>
                 (cmTarget *tgt,string *prop,string *config,CompatibleType t,char **param_5)

{
  char **param_4_local;
  CompatibleType t_local;
  string *config_local;
  string *prop_local;
  cmTarget *tgt_local;
  
  switch(t) {
  case BoolType:
    __assert_fail("0 && \"String compatibility check function called for boolean\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1930,
                  "const char *getLinkInterfaceDependentProperty(const cmTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  case StringType:
    tgt_local = (cmTarget *)cmTarget::GetLinkInterfaceDependentStringProperty(tgt,prop,config);
    break;
  case NumberMinType:
    tgt_local = (cmTarget *)cmTarget::GetLinkInterfaceDependentNumberMinProperty(tgt,prop,config);
    break;
  case NumberMaxType:
    tgt_local = (cmTarget *)cmTarget::GetLinkInterfaceDependentNumberMaxProperty(tgt,prop,config);
    break;
  default:
    __assert_fail("0 && \"Unreachable!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1939,
                  "const char *getLinkInterfaceDependentProperty(const cmTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  }
  return (char *)tgt_local;
}

Assistant:

const char * getLinkInterfaceDependentProperty(cmTarget const* tgt,
                                               const std::string& prop,
                                               const std::string& config,
                                               CompatibleType t,
                                               const char **)
{
  switch(t)
  {
  case BoolType:
    assert(0 && "String compatibility check function called for boolean");
    return 0;
  case StringType:
    return tgt->GetLinkInterfaceDependentStringProperty(prop, config);
  case NumberMinType:
    return tgt->GetLinkInterfaceDependentNumberMinProperty(prop, config);
  case NumberMaxType:
    return tgt->GetLinkInterfaceDependentNumberMaxProperty(prop, config);
  }
  assert(0 && "Unreachable!");
  return 0;
}